

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.cc
# Opt level: O2

S2Point * S2::FaceXYZtoUVW(S2Point *__return_storage_ptr__,int face,S2Point *p)

{
  undefined4 uVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  VType VVar5;
  
  switch(face) {
  case 0:
    uVar1 = *(undefined4 *)(p->c_ + 1);
    uVar2 = *(uint *)((long)p->c_ + 0xc);
    uVar3 = *(undefined4 *)(p->c_ + 2);
    uVar4 = *(uint *)((long)p->c_ + 0x14);
    VVar5 = p->c_[0];
    break;
  case 1:
    uVar1 = SUB84(p->c_[0],0);
    uVar2 = (uint)((ulong)p->c_[0] >> 0x20) ^ 0x80000000;
    VVar5 = p->c_[1];
    uVar3 = SUB84(p->c_[2],0);
    uVar4 = (uint)((ulong)p->c_[2] >> 0x20);
    break;
  case 2:
    uVar1 = *(undefined4 *)p->c_;
    uVar3 = *(undefined4 *)(p->c_ + 1);
    uVar2 = *(uint *)((long)p->c_ + 4) ^ 0x80000000;
    uVar4 = *(uint *)((long)p->c_ + 0xc) ^ 0x80000000;
    VVar5 = p->c_[2];
    break;
  case 3:
    uVar3 = *(undefined4 *)(p->c_ + 1);
    uVar1 = *(undefined4 *)(p->c_ + 2);
    uVar2 = *(uint *)((long)p->c_ + 0x14) ^ 0x80000000;
    uVar4 = *(uint *)((long)p->c_ + 0xc) ^ 0x80000000;
    VVar5 = -p->c_[0];
    break;
  case 4:
    uVar1 = SUB84(p->c_[2],0);
    uVar2 = (uint)((ulong)p->c_[2] >> 0x20) ^ 0x80000000;
    VVar5 = -p->c_[1];
    uVar3 = SUB84(p->c_[0],0);
    uVar4 = (uint)((ulong)p->c_[0] >> 0x20);
    break;
  default:
    uVar3 = *(undefined4 *)p->c_;
    uVar4 = *(uint *)((long)p->c_ + 4);
    uVar1 = *(undefined4 *)(p->c_ + 1);
    uVar2 = *(uint *)((long)p->c_ + 0xc);
    VVar5 = -p->c_[2];
  }
  *(undefined4 *)__return_storage_ptr__->c_ = uVar1;
  *(uint *)((long)__return_storage_ptr__->c_ + 4) = uVar2;
  *(undefined4 *)(__return_storage_ptr__->c_ + 1) = uVar3;
  *(uint *)((long)__return_storage_ptr__->c_ + 0xc) = uVar4;
  __return_storage_ptr__->c_[2] = VVar5;
  return __return_storage_ptr__;
}

Assistant:

S2Point FaceXYZtoUVW(int face, const S2Point& p) {
  // The result coordinates are simply the dot products of P with the (u,v,w)
  // axes for the given face (see kFaceUVWAxes).
  switch (face) {
    case 0:  return S2Point( p.y(),  p.z(),  p.x());
    case 1:  return S2Point(-p.x(),  p.z(),  p.y());
    case 2:  return S2Point(-p.x(), -p.y(),  p.z());
    case 3:  return S2Point(-p.z(), -p.y(), -p.x());
    case 4:  return S2Point(-p.z(),  p.x(), -p.y());
    default: return S2Point( p.y(),  p.x(), -p.z());
  }
}